

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O2

void __thiscall
DnsStats::ExportDnssecUsageByTable
          (DnsStats *this,BinHash<DnssecPrefixEntry> *dnssecTable,uint32_t registry_id)

{
  uint32_t i;
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  DnssecPrefixEntry *pDVar4;
  
  uVar3 = 0;
  uVar2 = 0;
  for (uVar1 = 0; uVar1 != dnssecTable->tableSize; uVar1 = uVar1 + 1) {
    pDVar4 = (DnssecPrefixEntry *)(dnssecTable->hashBin + uVar1);
    while (pDVar4 = pDVar4->HashNext, pDVar4 != (DnssecPrefixEntry *)0x0) {
      uVar3 = uVar3 + pDVar4->is_dnssec;
      uVar2 = uVar2 + (pDVar4->is_dnssec ^ 1);
    }
  }
  SubmitRegistryNumberAndCount(this,registry_id,0,(ulong)uVar2);
  SubmitRegistryNumberAndCount(this,registry_id,1,(ulong)uVar3);
  return;
}

Assistant:

void DnsStats::ExportDnssecUsageByTable(BinHash<DnssecPrefixEntry>* dnssecTable, uint32_t registry_id)
{
    DnssecPrefixEntry *dpe;
    uint32_t usage_count = 0;
    uint32_t nonusage_count = 0;

    for (uint32_t i = 0; i < dnssecTable->GetSize(); i++)
    {
        dpe = dnssecTable->GetEntry(i);

        while (dpe != NULL)
        {
            if (dpe->is_dnssec) {
                usage_count++;
            } else {
                nonusage_count++;
            }
            dpe = dpe->HashNext;
        }
    }
    
    SubmitRegistryNumberAndCount(registry_id, 0, nonusage_count);
    SubmitRegistryNumberAndCount(registry_id, 1, usage_count);
}